

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_entropy.c
# Opt level: O1

double * inform_local_block_entropy
                   (int *series,size_t n,size_t m,int b,size_t k,double *be,inform_error *err)

{
  int *piVar1;
  _Bool _Var2;
  double *__ptr;
  void *__ptr_00;
  int *piVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  size_t sVar7;
  void *pvVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double *local_70;
  
  _Var2 = check_arguments(series,n,m,b,k,err);
  if (_Var2) {
    return (double *)0x0;
  }
  lVar6 = (m - k) + 1;
  lVar13 = lVar6 * n;
  local_70 = be;
  if ((be != (double *)0x0) || (local_70 = (double *)malloc(lVar13 * 8), local_70 != (double *)0x0))
  {
    auVar16._8_4_ = (int)(k >> 0x20);
    auVar16._0_8_ = k;
    auVar16._12_4_ = 0x45300000;
    dVar14 = pow((double)b,
                 (auVar16._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)k) - 4503599627370496.0));
    __ptr = (double *)
            calloc((long)(dVar14 - 9.223372036854776e+18) & (long)dVar14 >> 0x3f | (long)dVar14,4);
    if (__ptr == (double *)0x0) {
      __ptr = local_70;
      if (be != (double *)0x0) goto LAB_001578b9;
    }
    else {
      __ptr_00 = malloc(lVar13 * 4);
      if (__ptr_00 != (void *)0x0) {
        if (n != 0) {
          piVar3 = series + (k - 1);
          sVar7 = 0;
          pvVar8 = __ptr_00;
          do {
            if (k == 1) {
              iVar9 = 1;
              iVar10 = 0;
            }
            else {
              uVar11 = 0;
              iVar9 = 1;
              iVar10 = 0;
              do {
                iVar9 = iVar9 * b;
                iVar10 = iVar10 * b + series[uVar11];
                uVar11 = uVar11 + 1;
              } while (k - 1 != uVar11);
            }
            if (k - 1 < m) {
              lVar12 = 0;
              do {
                lVar5 = (long)(iVar10 * b) + (long)piVar3[lVar12];
                iVar4 = (int)lVar5;
                *(int *)((long)pvVar8 + lVar12 * 4) = iVar4;
                piVar1 = (int *)((long)__ptr + lVar5 * 4);
                *piVar1 = *piVar1 + 1;
                if (m - k != lVar12) {
                  iVar10 = iVar4 - series[lVar12] * iVar9;
                }
                lVar12 = lVar12 + 1;
              } while (lVar6 != lVar12);
            }
            sVar7 = sVar7 + 1;
            series = series + m;
            piVar3 = piVar3 + m;
            pvVar8 = (void *)((long)pvVar8 + m * 4 + k * -4 + 4);
          } while (sVar7 != n);
        }
        if (lVar13 != 0) {
          auVar15._8_4_ = (int)((ulong)lVar13 >> 0x20);
          auVar15._0_8_ = lVar13;
          auVar15._12_4_ = 0x45300000;
          lVar6 = 0;
          do {
            dVar14 = log2((double)*(uint *)((long)__ptr +
                                           (long)*(int *)((long)__ptr_00 + lVar6 * 4) * 4) /
                          ((auVar15._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0)));
            local_70[lVar6] = -dVar14;
            lVar6 = lVar6 + 1;
          } while (lVar13 != lVar6);
        }
        free(__ptr_00);
        free(__ptr);
        return local_70;
      }
      if (be == (double *)0x0) {
        free(local_70);
      }
    }
    free(__ptr);
  }
LAB_001578b9:
  if (err != (inform_error *)0x0) {
    *err = INFORM_ENOMEM;
  }
  return (double *)0x0;
}

Assistant:

double *inform_local_block_entropy(int const *series, size_t n, size_t m, int b,
    size_t k, double *be, inform_error *err)
{
    if (check_arguments(series, n, m, b, k, err)) return NULL;

    size_t const N = n * (m - k + 1);

    bool allocate_be = (be == NULL);
    if (allocate_be)
    {
        be = malloc(N * sizeof(double));
        if (be == NULL)
        {
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
        }
    }

    size_t const states_size = (size_t) pow((double) b, (double) k);

    uint32_t *data = calloc(states_size, sizeof(uint32_t));
    if (data == NULL)
    {
        if (allocate_be) free(be);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }

    inform_dist states = { data, states_size, N };

    int *state = malloc(N * sizeof(int));
    if (state == NULL)
    {
        if (allocate_be) free(be);
        free(data);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }

    accumulate_local_observations(series, n, m, b, k, &states, state);

    double s;
    for (size_t i = 0; i < N; ++i)
    {
        s = states.histogram[state[i]];
        be[i] = -log2(s/N);
    }

    free(state);
    free(data);

    return be;
}